

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFArray.cpp
# Opt level: O0

void __thiscall PDFArray::~PDFArray(PDFArray *this)

{
  bool bVar1;
  reference ppPVar2;
  __normal_iterator<PDFObject_**,_std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> local_20;
  __normal_iterator<PDFObject_**,_std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> local_18;
  iterator it;
  PDFArray *this_local;
  
  (this->super_PDFObject).super_RefCountObject._vptr_RefCountObject =
       (_func_int **)&PTR__PDFArray_0054e988;
  it._M_current = (PDFObject **)this;
  local_18._M_current =
       (PDFObject **)std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>::begin(&this->mValues);
  while( true ) {
    local_20._M_current =
         (PDFObject **)std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>::end(&this->mValues);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<PDFObject_**,_std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
              ::operator*(&local_18);
    RefCountObject::Release(&(*ppPVar2)->super_RefCountObject);
    __gnu_cxx::
    __normal_iterator<PDFObject_**,_std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>::
    operator++(&local_18);
  }
  std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>::~vector(&this->mValues);
  PDFObject::~PDFObject(&this->super_PDFObject);
  return;
}

Assistant:

PDFArray::~PDFArray(void)
{
	PDFObjectVector::iterator it = mValues.begin();

	for(; it != mValues.end(); ++it)
		(*it)->Release();
}